

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3PcacheRelease(PgHdr *p)

{
  i16 *piVar1;
  PCache *pPVar2;
  
  pPVar2 = p->pCache;
  pPVar2->nRefSum = pPVar2->nRefSum + -1;
  piVar1 = &p->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    if ((p->flags & 1) == 0) {
      pcacheManageDirtyList(p,'\x03');
      return;
    }
    if (pPVar2->bPurgeable != '\0') {
      (*sqlite3Config.pcache2.xUnpin)(pPVar2->pCache,p->pPage,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->pCache->nRefSum--;
  if( (--p->nRef)==0 ){
    if( p->flags&PGHDR_CLEAN ){
      pcacheUnpin(p);
    }else{
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    }
  }
}